

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O3

scoped_dfs_traverser * __thiscall
clipp::detail::scoped_dfs_traverser::operator++(scoped_dfs_traverser *this)

{
  pointer pcVar1;
  child_t<clipp::parameter,_clipp::group> *pcVar2;
  bool bVar3;
  child_t<clipp::parameter,_clipp::group> *pcVar4;
  pointer pcVar5;
  context *t;
  
  pcVar5 = (this->pos_).stack_.
           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar1 = (this->pos_).stack_.
           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pcVar5 == pcVar1) {
    return this;
  }
  do {
    if ((pcVar5->cur)._M_current + 1 != (pcVar5->end)._M_current) goto LAB_001379cb;
    pcVar5 = pcVar5 + 1;
  } while (pcVar5 != pcVar1);
  if ((pcVar1[-1].cur._M_current)->type_ != group) {
    return_to_outermost_scope(this);
    return this;
  }
LAB_001379cb:
  if (((this->ignoreBlocks_ != false) || (bVar3 = matched(this), bVar3)) ||
     (((this->pos_).stack_.
       super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1].cur._M_current)->type_ == group))
  goto LAB_001379f1;
  pcVar4 = (child_t<clipp::parameter,_clipp::group> *)
           group::depth_first_traverser::outermost_blocking_group_fully_explored(&this->pos_);
  if ((pcVar4 == (child_t<clipp::parameter,_clipp::group> *)0x0) ||
     (bVar3 = group::depth_first_traverser::is_inside(&this->lastMatch_,(group *)pcVar4), bVar3)) {
    pcVar5 = (this->pos_).stack_.
             super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pcVar4 = pcVar5[-1].cur._M_current;
    if (pcVar4->type_ == param) {
      if (*(bool *)((long)&pcVar4->m_ + 0x21) == true) goto LAB_00137a99;
    }
    else if ((pcVar4->type_ == group) && (bVar3 = group::blocking((group *)pcVar4), bVar3)) {
      pcVar5 = (this->pos_).stack_.
               super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
               ._M_impl.super__Vector_impl_data._M_finish;
LAB_00137a99:
      if ((pcVar5[-1].parent)->exclusive_ != false) goto LAB_00137ab7;
      if ((this->pos_).stack_.
          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
          ._M_impl.super__Vector_impl_data._M_start != pcVar5) goto LAB_00137aa8;
      goto LAB_00137abf;
    }
LAB_001379f1:
    group::depth_first_traverser::operator++(&this->pos_);
  }
  else {
    pcVar1 = (this->pos_).stack_.
             super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar5 = (this->pos_).stack_.
             super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    while ((pcVar1 != pcVar5 &&
           ((pcVar2 = pcVar5[-1].cur._M_current, pcVar2 != pcVar4 || (pcVar2->type_ != group))))) {
      pcVar5 = pcVar5 + -1;
      (this->pos_).stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_finish = pcVar5;
    }
    if (pcVar1 != pcVar5) {
LAB_00137aa8:
      pcVar5[-1].cur._M_current = pcVar5[-1].end._M_current + -1;
LAB_00137ab7:
      group::depth_first_traverser::next_sibling(&this->pos_);
LAB_00137abf:
      if ((this->pos_).stack_.
          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (this->pos_).stack_.
          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
          ._M_impl.super__Vector_impl_data._M_finish) goto LAB_001379f9;
    }
    return_to_outermost_scope(this);
  }
LAB_001379f9:
  check_if_left_scope(this);
  return this;
}

Assistant:

scoped_dfs_traverser&
    operator ++ ()
    {
        if(!pos_) return *this;

        if(pos_.is_last_in_path()) {
            return_to_outermost_scope();
            return *this;
        }

        //current pattern can block if it didn't match already
        if(ignoreBlocks_ || matched()) {
            ++pos_;
        }
        else if(!pos_->is_group()) {
            //current group can block if we didn't have any match in it
            const group* g = pos_.outermost_blocking_group_fully_explored();
            //no match in 'g' before -> skip to after its siblings
            if(g && !lastMatch_.is_inside(g)) {
                pos_.back_to_ancestor(g).next_after_siblings();
                if(!pos_) return_to_outermost_scope();
            }
            else if(pos_->blocking()) {
                if(pos_.parent().exclusive()) {
                    pos_.next_sibling();
                } else {
                    //no match => skip siblings of blocking param
                    pos_.next_after_siblings();
                }
                if(!pos_) return_to_outermost_scope();
            } else {
                ++pos_;
            }
        } else {
            ++pos_;
        }
        check_if_left_scope();
        return *this;
    }